

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# detour.c
# Opt level: O1

int detour_uninstall(detour d,detour_handle handle)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  
  if (d == (detour)0x0 || handle == (detour_handle)0x0) {
    log_write_impl_va("metacall",0x86,"detour_uninstall",
                      "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/detour/source/detour.c"
                      ,3,"Invalid uninstall arguments");
    uVar2 = 1;
  }
  else {
    lVar3 = plugin_iface();
    uVar1 = (**(code **)(lVar3 + 0x10))(handle->impl);
    if (uVar1 != 0) {
      log_write_impl_va("metacall",0x8f,"detour_uninstall",
                        "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/detour/source/detour.c"
                        ,3,"Invalid detour implementation handle uninstallation");
    }
    lVar3 = plugin_iface(d);
    uVar2 = (**(code **)(lVar3 + 0x18))(handle->impl);
    uVar2 = uVar2 | uVar1;
    if (uVar2 != 0) {
      log_write_impl_va("metacall",0x96,"detour_uninstall",
                        "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/detour/source/detour.c"
                        ,3,"Invalid detour implementation handle destruction");
    }
    free(handle);
  }
  return uVar2;
}

Assistant:

int detour_uninstall(detour d, detour_handle handle)
{
	int result = 0;

	if (d == NULL || handle == NULL)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Invalid uninstall arguments");

		return 1;
	}

	result |= detour_iface(d)->uninstall(handle->impl);

	if (result != 0)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Invalid detour implementation handle uninstallation");
	}

	result |= detour_iface(d)->destroy(handle->impl);

	if (result != 0)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Invalid detour implementation handle destruction");
	}

	free(handle);

	return result;
}